

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

raw_problem_status parse(context *ctx,stream_buffer *buf,problem_parser *p)

{
  string_view *psVar1;
  pointer pvVar2;
  string_view first;
  string_view rhs;
  string_view buf_1;
  string_view buf_1_00;
  string_view rhs_00;
  string_view buf_1_01;
  string_view str;
  string_view buf_1_02;
  string_view buf_1_03;
  string_view buf_1_04;
  string_view buf_1_05;
  string_view buf_1_06;
  string_view rhs_01;
  string_view rhs_02;
  string_view buf_1_07;
  string_view rhs_03;
  string_view value_00;
  string_view rhs_04;
  string_view buf_1_08;
  string_view rhs_05;
  string_view value_01;
  string_view rhs_06;
  string_view buf_1_09;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  problem_parser *ppVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  optional<baryonyx::objective_function_type> oVar11;
  ulong uVar12;
  undefined8 uVar13;
  long lVar14;
  undefined8 uVar15;
  size_type __rlen;
  size_t sVar16;
  char *pcVar17;
  char cVar18;
  long lVar19;
  double sign_factor;
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view lhs_02;
  string_view lhs_03;
  string_view lhs_04;
  string_view lhs_05;
  string_view lhs_06;
  string_view lhs_07;
  string_view rhs_07;
  string_view rhs_08;
  string_view rhs_09;
  string_view rhs_10;
  string_view rhs_11;
  string_view rhs_12;
  raw_problem_status rVar20;
  optional<operator_token> oVar21;
  raw_problem_status rVar22;
  string_view sVar23;
  int value;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> elements;
  optional<real_token> value_opt;
  value_type tmp;
  uint local_1f4;
  ulong local_1f0;
  ulong local_1e8;
  int local_1e0;
  int local_1dc;
  _Vector_impl_data *local_1d8;
  problem_parser *local_1d0;
  basic_string_view<char,_std::char_traits<char>_> *local_1c8;
  basic_string_view<char,_std::char_traits<char>_> *local_1c0;
  basic_string_view<char,_std::char_traits<char>_> *local_1b8;
  basic_string_view<char,_std::char_traits<char>_> *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> *local_1a8;
  basic_string_view<char,_std::char_traits<char>_> *local_1a0;
  basic_string_view<char,_std::char_traits<char>_> *local_198;
  basic_string_view<char,_std::char_traits<char>_> *local_190;
  basic_string_view<char,_std::char_traits<char>_> *local_188;
  _Vector_impl_data *local_180;
  _Storage<bound_token,_true> local_178;
  char local_150;
  string_view local_148;
  _Storage<real_token,_true> local_130;
  char local_120;
  vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *local_118;
  vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *local_110;
  _Storage<function_element_token,_true> local_108;
  size_t sStack_e8;
  char *pcStack_e0;
  size_t sStack_d8;
  char *pcStack_d0;
  size_t sStack_c8;
  char *pcStack_c0;
  size_t sStack_b8;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_a0;
  size_t sStack_98;
  char *pcStack_90;
  size_t sStack_88;
  char *pcStack_80;
  size_t sStack_78;
  char *pcStack_70;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  
  sVar23._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  sVar23._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  oVar11 = read_objective_type(sVar23);
  if (((ulong)oVar11.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
              super__Optional_payload_base<baryonyx::objective_function_type> >> 0x20 & 1) == 0) {
    uVar12 = 5;
  }
  else {
    (p->m_problem).type =
         oVar11.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
         super__Optional_payload_base<baryonyx::objective_function_type>._M_payload;
    local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
    local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
    pcVar17 = (buf->buffer_ptr)._M_elems[1]._M_str;
    sVar16 = (buf->buffer_ptr)._M_elems[2]._M_len;
    pcVar3 = (buf->buffer_ptr)._M_elems[2]._M_str;
    sVar4 = (buf->buffer_ptr)._M_elems[3]._M_len;
    pcVar5 = (buf->buffer_ptr)._M_elems[3]._M_str;
    (buf->buffer_ptr)._M_elems[0]._M_len = (buf->buffer_ptr)._M_elems[1]._M_len;
    (buf->buffer_ptr)._M_elems[0]._M_str = pcVar17;
    (buf->buffer_ptr)._M_elems[1]._M_len = sVar16;
    (buf->buffer_ptr)._M_elems[1]._M_str = pcVar3;
    (buf->buffer_ptr)._M_elems[2]._M_len = sVar4;
    (buf->buffer_ptr)._M_elems[2]._M_str = pcVar5;
    pcVar17 = (buf->buffer_ptr)._M_elems[4]._M_str;
    sVar16 = (buf->buffer_ptr)._M_elems[5]._M_len;
    pcVar3 = (buf->buffer_ptr)._M_elems[5]._M_str;
    (buf->buffer_ptr)._M_elems[3]._M_len = (buf->buffer_ptr)._M_elems[4]._M_len;
    (buf->buffer_ptr)._M_elems[3]._M_str = pcVar17;
    (buf->buffer_ptr)._M_elems[4]._M_len = sVar16;
    (buf->buffer_ptr)._M_elems[4]._M_str = pcVar3;
    pcVar17 = (buf->buffer_ptr)._M_elems[6]._M_str;
    sVar16 = (buf->buffer_ptr)._M_elems[7]._M_len;
    pcVar3 = (buf->buffer_ptr)._M_elems[7]._M_str;
    (buf->buffer_ptr)._M_elems[5]._M_len = (buf->buffer_ptr)._M_elems[6]._M_len;
    (buf->buffer_ptr)._M_elems[5]._M_str = pcVar17;
    (buf->buffer_ptr)._M_elems[6]._M_len = sVar16;
    (buf->buffer_ptr)._M_elems[6]._M_str = pcVar3;
    pcVar17 = (buf->buffer_ptr)._M_elems[8]._M_str;
    (buf->buffer_ptr)._M_elems[7]._M_len = (buf->buffer_ptr)._M_elems[8]._M_len;
    (buf->buffer_ptr)._M_elems[7]._M_str = pcVar17;
    pcVar17 = (buf->buffer_ptr)._M_elems[9]._M_str;
    (buf->buffer_ptr)._M_elems[8]._M_len = (buf->buffer_ptr)._M_elems[9]._M_len;
    (buf->buffer_ptr)._M_elems[8]._M_str = pcVar17;
    (buf->buffer_ptr)._M_elems[9]._M_len = (size_t)local_108._M_value.factor;
    (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_108._M_value.name._M_len;
    sVar23 = stream_buffer::next_token(buf);
    (buf->buffer_ptr)._M_elems[9] = sVar23;
    first._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    first._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar9 = try_read_objective_label(first,(buf->buffer_ptr)._M_elems[1]);
    if (iVar9 != 0) {
      stream_buffer::pop_front(buf,iVar9);
    }
    local_1c8 = (buf->buffer_ptr)._M_elems + 1;
    local_188 = (buf->buffer_ptr)._M_elems + 2;
    local_190 = (buf->buffer_ptr)._M_elems + 3;
    local_198 = (buf->buffer_ptr)._M_elems + 4;
    local_1a0 = (buf->buffer_ptr)._M_elems + 5;
    local_1a8 = (buf->buffer_ptr)._M_elems + 6;
    local_1b0 = (buf->buffer_ptr)._M_elems + 7;
    local_1b8 = (buf->buffer_ptr)._M_elems + 8;
    local_1c0 = (buf->buffer_ptr)._M_elems + 9;
    sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
    pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
    rhs._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    rhs._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    lhs._M_str = "binary";
    lhs._M_len = 6;
    local_1d0 = p;
    bVar7 = are_equal(lhs,rhs);
    if (bVar7) {
      local_1f0 = 0;
      rVar20 = (raw_problem_status)ZEXT812(5);
    }
    else {
      rVar20 = (raw_problem_status)ZEXT812(5);
      local_1f0 = 0;
      do {
        lVar19 = 0x18;
        do {
          lVar14 = lVar19;
          if (lVar14 == 0xe8) goto LAB_0013bb4c;
          rhs_07._M_str = pcVar17;
          rhs_07._M_len = sVar16;
          bVar7 = are_equal(*(string_view *)(&UNK_007389d8 + lVar14),rhs_07);
          lVar19 = lVar14 + 0x10;
        } while (!bVar7);
        if (lVar14 != 0xe8) break;
LAB_0013bb4c:
        sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
        pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
        buf_1_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        buf_1._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        psVar1 = (buf->buffer_ptr)._M_elems + 1;
        sVar23 = *psVar1;
        bVar7 = starts_with_quadratic(buf_1,*psVar1);
        if (bVar7) {
          sign_factor = 1.0;
          if (sVar16 == 1) {
            iVar9 = bcmp(pcVar17,"-",1);
            if (iVar9 == 0) {
              local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
              local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
              pcVar17 = local_1c8->_M_str;
              (buf->buffer_ptr)._M_elems[0]._M_len = local_1c8->_M_len;
              (buf->buffer_ptr)._M_elems[0]._M_str = pcVar17;
              pcVar17 = local_188->_M_str;
              local_1c8->_M_len = local_188->_M_len;
              local_1c8->_M_str = pcVar17;
              pcVar17 = local_190->_M_str;
              local_188->_M_len = local_190->_M_len;
              local_188->_M_str = pcVar17;
              pcVar17 = local_198->_M_str;
              local_190->_M_len = local_198->_M_len;
              local_190->_M_str = pcVar17;
              pcVar17 = local_1a0->_M_str;
              local_198->_M_len = local_1a0->_M_len;
              local_198->_M_str = pcVar17;
              pcVar17 = local_1a8->_M_str;
              local_1a0->_M_len = local_1a8->_M_len;
              local_1a0->_M_str = pcVar17;
              pcVar17 = local_1b0->_M_str;
              local_1a8->_M_len = local_1b0->_M_len;
              local_1a8->_M_str = pcVar17;
              pcVar17 = local_1b8->_M_str;
              local_1b0->_M_len = local_1b8->_M_len;
              local_1b0->_M_str = pcVar17;
              pcVar17 = local_1c0->_M_str;
              local_1b8->_M_len = local_1c0->_M_len;
              local_1b8->_M_str = pcVar17;
              local_1c0->_M_len = (size_t)local_108._M_value.factor;
              local_1c0->_M_str = (char *)local_108._M_value.name._M_len;
              sVar23 = stream_buffer::next_token(buf);
              (buf->buffer_ptr)._M_elems[9] = sVar23;
              sign_factor = -1.0;
            }
            else {
              iVar9 = bcmp(pcVar17,"+",1);
              sign_factor = 1.0;
              if (iVar9 == 0) {
                local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
                local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
                pcVar17 = local_1c8->_M_str;
                (buf->buffer_ptr)._M_elems[0]._M_len = local_1c8->_M_len;
                (buf->buffer_ptr)._M_elems[0]._M_str = pcVar17;
                pcVar17 = local_188->_M_str;
                local_1c8->_M_len = local_188->_M_len;
                local_1c8->_M_str = pcVar17;
                pcVar17 = local_190->_M_str;
                local_188->_M_len = local_190->_M_len;
                local_188->_M_str = pcVar17;
                pcVar17 = local_198->_M_str;
                local_190->_M_len = local_198->_M_len;
                local_190->_M_str = pcVar17;
                pcVar17 = local_1a0->_M_str;
                local_198->_M_len = local_1a0->_M_len;
                local_198->_M_str = pcVar17;
                pcVar17 = local_1a8->_M_str;
                local_1a0->_M_len = local_1a8->_M_len;
                local_1a0->_M_str = pcVar17;
                pcVar17 = local_1b0->_M_str;
                local_1a8->_M_len = local_1b0->_M_len;
                local_1a8->_M_str = pcVar17;
                pcVar17 = local_1b8->_M_str;
                local_1b0->_M_len = local_1b8->_M_len;
                local_1b0->_M_str = pcVar17;
                pcVar17 = local_1c0->_M_str;
                local_1b8->_M_len = local_1c0->_M_len;
                local_1b8->_M_str = pcVar17;
                local_1c0->_M_len = (size_t)local_108._M_value.factor;
                local_1c0->_M_str = (char *)local_108._M_value.name._M_len;
                sVar23 = stream_buffer::next_token(buf);
                (buf->buffer_ptr)._M_elems[9] = sVar23;
                sign_factor = 1.0;
              }
            }
          }
          rVar20 = read_quadratic_element(buf,local_1d0,sign_factor);
          local_1f0 = rVar20._0_8_ >> 0x20;
          if (rVar20.tag != success) goto LAB_0013cb80;
        }
        else {
          psVar1 = (buf->buffer_ptr)._M_elems + 2;
          local_40 = psVar1->_M_len;
          pcStack_38 = (buf->buffer_ptr)._M_elems[2]._M_str;
          read_function_element
                    ((optional<function_element_token> *)&local_108._M_value,buf_1_00,sVar23,*psVar1
                    );
          iVar9 = 0;
          if ((char)sStack_e8 == '\x01') {
            bVar7 = problem_parser::append_to_objective(local_1d0,&local_108._M_value);
            if (bVar7) {
              iVar9 = 2;
              stream_buffer::pop_front(buf,local_108._M_value.read);
            }
            else {
              iVar9 = 1;
              local_1f0 = 0;
              rVar20 = (raw_problem_status)ZEXT812(0xb);
            }
          }
          if (iVar9 != 2) {
            if (iVar9 == 0) {
              local_1f0 = 0;
              rVar20 = (raw_problem_status)ZEXT812(6);
            }
            goto LAB_0013cb80;
          }
        }
        sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
        pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
        rhs_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        rhs_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        lhs_00._M_str = "binary";
        lhs_00._M_len = 6;
        bVar7 = are_equal(lhs_00,rhs_00);
      } while (!bVar7);
    }
    buf_1_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar9 = read_subject_to(buf_1_01,(buf->buffer_ptr)._M_elems[1],(buf->buffer_ptr)._M_elems[2]);
    bVar7 = true;
    if (iVar9 != 0) {
      stream_buffer::pop_front(buf,iVar9);
      local_180 = (_Vector_impl_data *)&(local_1d0->m_problem).less_constraints;
      local_110 = (vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                  &(local_1d0->m_problem).greater_constraints;
      local_118 = (vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                  &(local_1d0->m_problem).equal_constraints;
      local_1d8 = (_Vector_impl_data *)((ulong)local_1d8 & 0xffffffff00000000);
      do {
        sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
        if (sVar16 == 0) {
LAB_0013c53f:
          if ((ulong)(((long)(local_1d0->m_problem).less_constraints.
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_1d0->m_problem).less_constraints.
                             super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                     ((long)(local_1d0->m_problem).greater_constraints.
                            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_1d0->m_problem).greater_constraints.
                            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                     ((long)(local_1d0->m_problem).equal_constraints.
                            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_1d0->m_problem).equal_constraints.
                            super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
              >> 0x1f == 0) goto LAB_0013c5aa;
          local_1f0 = 0;
          rVar20 = (raw_problem_status)ZEXT812(0xc);
          break;
        }
        pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
        lhs_01._M_str = "binary";
        lhs_01._M_len = 6;
        rhs_08._M_str = pcVar17;
        rhs_08._M_len = sVar16;
        bVar8 = are_equal(lhs_01,rhs_08);
        if (bVar8) goto LAB_0013c53f;
        lVar19 = 0x18;
        do {
          lVar14 = lVar19;
          if (lVar14 == 0xe8) goto LAB_0013bee4;
          rhs_09._M_str = pcVar17;
          rhs_09._M_len = sVar16;
          bVar8 = are_equal(*(string_view *)(&UNK_007389d8 + lVar14),rhs_09);
          lVar19 = lVar14 + 0x10;
        } while (!bVar8);
        if (lVar14 != 0xe8) goto LAB_0013c53f;
LAB_0013bee4:
        ppVar6 = local_1d0;
        local_148 = (string_view)ZEXT816(0);
        local_178._M_value.min = 0.0;
        local_178._M_value.max = 0.0;
        local_178._M_value.name._M_len = 0;
        if (((((buf->buffer_ptr)._M_elems[0]._M_len != 0) &&
             (bVar8 = is_char_name((int)*(buf->buffer_ptr)._M_elems[0]._M_str), bVar8)) &&
            (local_1c8->_M_len == 1)) &&
           (iVar9 = bcmp((buf->buffer_ptr)._M_elems[1]._M_str,":",1), iVar9 == 0)) {
          str._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          str._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
          local_148 = baryonyx::string_buffer::append
                                ((ppVar6->m_problem).strings.
                                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,str);
          local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          pcVar17 = local_188->_M_str;
          (buf->buffer_ptr)._M_elems[0]._M_len = local_188->_M_len;
          (buf->buffer_ptr)._M_elems[0]._M_str = pcVar17;
          pcVar17 = local_190->_M_str;
          local_1c8->_M_len = local_190->_M_len;
          local_1c8->_M_str = pcVar17;
          pcVar17 = local_198->_M_str;
          local_188->_M_len = local_198->_M_len;
          local_188->_M_str = pcVar17;
          pcVar17 = local_1a0->_M_str;
          local_190->_M_len = local_1a0->_M_len;
          local_190->_M_str = pcVar17;
          pcVar17 = local_1a8->_M_str;
          local_198->_M_len = local_1a8->_M_len;
          local_198->_M_str = pcVar17;
          pcVar17 = local_1b0->_M_str;
          local_1a0->_M_len = local_1b0->_M_len;
          local_1a0->_M_str = pcVar17;
          pcVar17 = local_1b8->_M_str;
          local_1a8->_M_len = local_1b8->_M_len;
          local_1a8->_M_str = pcVar17;
          pcVar17 = local_1c0->_M_str;
          local_1b0->_M_len = local_1c0->_M_len;
          local_1b0->_M_str = pcVar17;
          pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
          local_1b8->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          local_1b8->_M_str = pcVar17;
          local_1c0->_M_len = (size_t)local_108._M_value.factor;
          local_1c0->_M_str = (char *)local_108._M_value.name._M_len;
          lVar19 = 0x88;
          do {
            sVar23 = stream_buffer::next_token(buf);
            *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar19 + -8) = sVar23._M_len;
            *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar19) = sVar23._M_str;
            lVar19 = lVar19 + 0x10;
          } while (lVar19 != 0xa8);
        }
        buf_1_02._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_02._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        psVar1 = (buf->buffer_ptr)._M_elems + 2;
        local_50 = psVar1->_M_len;
        pcStack_48 = (buf->buffer_ptr)._M_elems[2]._M_str;
        read_function_element
                  ((optional<function_element_token> *)&local_108._M_value,buf_1_02,
                   (buf->buffer_ptr)._M_elems[1],*psVar1);
        if ((char)sStack_e8 == '\x01') {
          value_03._M_str = local_108._M_value.name._M_str;
          value_03._M_len = local_108._M_value.name._M_len;
          iVar9 = problem_parser::get_or_assign_variable(ppVar6,value_03);
          local_130._0_4_ = iVar9;
          if (iVar9 == -1) {
            local_1f0 = 0;
            rVar20 = (raw_problem_status)ZEXT812(0xb);
          }
          else {
            lVar19 = (long)local_178._M_value.max - local_178._0_8_ >> 5;
            uVar15 = local_178._M_value.min;
            if (0 < lVar19) {
              uVar15 = ((long)local_178._M_value.max - local_178._0_8_ & 0xffffffffffffffe0U) +
                       (long)local_178._M_value.min;
              lVar19 = lVar19 + 1;
              uVar13 = (long)local_178._M_value.min + 0x10;
              do {
                if (*(int *)(uVar13 + 0xffffffffffffffe8 + 0xc) == iVar9) {
                  uVar13 = (_Vector_impl_data *)(uVar13 + 0xffffffffffffffe8 + 8);
                  goto LAB_0013c171;
                }
                if (*(int *)(uVar13 + 0xffffffffffffffe8 + 0x14) == iVar9) {
                  uVar13 = (pointer *)(uVar13 + 0xffffffffffffffe8 + 0x10);
                  goto LAB_0013c171;
                }
                if (*(int *)((long)&((_Vector_impl_data *)uVar13)->_M_start + 4) == iVar9)
                goto LAB_0013c171;
                if (*(int *)((long)&((_Vector_impl_data *)uVar13)->_M_finish + 4) == iVar9) {
                  uVar13 = &((_Vector_impl_data *)uVar13)->_M_finish;
                  goto LAB_0013c171;
                }
                lVar19 = lVar19 + -1;
                uVar13 = uVar13 + 0x18 + 8;
              } while (1 < lVar19);
            }
            lVar19 = (long)local_178._M_value.max - uVar15 >> 3;
            if (lVar19 == 1) {
LAB_0013c137:
              uVar13 = uVar15;
              if (*(int *)((long)&((_Vector_impl_data *)uVar15)->_M_start + 4) != iVar9) {
                uVar13 = local_178._M_value.max;
              }
            }
            else if (lVar19 == 2) {
LAB_0013c12d:
              uVar13 = uVar15;
              if (*(int *)((long)&((_Vector_impl_data *)uVar15)->_M_start + 4) != iVar9) {
                uVar15 = &((_Vector_impl_data *)uVar15)->_M_finish;
                goto LAB_0013c137;
              }
            }
            else {
              uVar13 = local_178._M_value.max;
              if ((lVar19 == 3) &&
                 (uVar13 = uVar15,
                 *(int *)((long)&((_Vector_impl_data *)uVar15)->_M_start + 4) != iVar9)) {
                uVar15 = &((_Vector_impl_data *)uVar15)->_M_finish;
                goto LAB_0013c12d;
              }
            }
LAB_0013c171:
            if ((double)uVar13 == local_178._M_value.max) {
              local_1e0 = (int)local_108._M_value.factor;
              std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
              emplace_back<int,int&>
                        ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                          *)&local_178._M_value,&local_1e0,(int *)&local_130);
            }
            else {
              *(int *)&((_Vector_impl_data *)uVar13)->_M_start =
                   *(int *)&((_Vector_impl_data *)uVar13)->_M_start + (int)local_108._M_value.factor
              ;
            }
          }
          if (iVar9 != -1) {
            stream_buffer::pop_front(buf,local_108._M_value.read);
            while( true ) {
              buf_1_04._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
              buf_1_04._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
              buf_1_03._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
              buf_1_03._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
              if (((buf->buffer_ptr)._M_elems[0]._M_len == 0) ||
                 ((byte)(*(buf->buffer_ptr)._M_elems[0]._M_str - 0x3cU) < 3)) break;
              psVar1 = (buf->buffer_ptr)._M_elems + 2;
              local_60 = psVar1->_M_len;
              pcStack_58 = (buf->buffer_ptr)._M_elems[2]._M_str;
              read_function_element
                        ((optional<function_element_token> *)&local_108._M_value,buf_1_03,
                         (buf->buffer_ptr)._M_elems[1],*psVar1);
              if ((char)sStack_e8 != '\x01') {
                local_1f0 = 0;
                rVar20 = (raw_problem_status)ZEXT812(10);
                goto LAB_0013c48c;
              }
              value_04._M_str = local_108._M_value.name._M_str;
              value_04._M_len = local_108._M_value.name._M_len;
              iVar9 = problem_parser::get_or_assign_variable(ppVar6,value_04);
              local_130._0_4_ = iVar9;
              if (iVar9 == -1) {
                local_1f0 = 0;
                rVar20 = (raw_problem_status)ZEXT812(0xb);
              }
              else {
                lVar19 = (long)local_178._M_value.max - local_178._0_8_ >> 5;
                uVar15 = local_178._M_value.min;
                if (0 < lVar19) {
                  uVar15 = ((long)local_178._M_value.max - local_178._0_8_ & 0xffffffffffffffe0U) +
                           (long)local_178._M_value.min;
                  lVar19 = lVar19 + 1;
                  uVar13 = (long)local_178._M_value.min + 0x10;
                  do {
                    if (*(int *)(uVar13 + 0xffffffffffffffe8 + 0xc) == iVar9) {
                      uVar13 = (_Vector_impl_data *)(uVar13 + 0xffffffffffffffe8 + 8);
                      goto LAB_0013c31d;
                    }
                    if (*(int *)(uVar13 + 0xffffffffffffffe8 + 0x14) == iVar9) {
                      uVar13 = (pointer *)(uVar13 + 0xffffffffffffffe8 + 0x10);
                      goto LAB_0013c31d;
                    }
                    if (*(int *)((long)&((_Vector_impl_data *)uVar13)->_M_start + 4) == iVar9)
                    goto LAB_0013c31d;
                    if (*(int *)((long)&((_Vector_impl_data *)uVar13)->_M_finish + 4) == iVar9) {
                      uVar13 = &((_Vector_impl_data *)uVar13)->_M_finish;
                      goto LAB_0013c31d;
                    }
                    lVar19 = lVar19 + -1;
                    uVar13 = uVar13 + 0x18 + 8;
                  } while (1 < lVar19);
                }
                lVar19 = (long)local_178._M_value.max - uVar15 >> 3;
                if (lVar19 == 1) {
LAB_0013c2e3:
                  uVar13 = uVar15;
                  if (*(int *)((long)&((_Vector_impl_data *)uVar15)->_M_start + 4) != iVar9) {
                    uVar13 = local_178._M_value.max;
                  }
                }
                else if (lVar19 == 2) {
LAB_0013c2d9:
                  uVar13 = uVar15;
                  if (*(int *)((long)&((_Vector_impl_data *)uVar15)->_M_start + 4) != iVar9) {
                    uVar15 = &((_Vector_impl_data *)uVar15)->_M_finish;
                    goto LAB_0013c2e3;
                  }
                }
                else {
                  uVar13 = local_178._M_value.max;
                  if ((lVar19 == 3) &&
                     (uVar13 = uVar15,
                     *(int *)((long)&((_Vector_impl_data *)uVar15)->_M_start + 4) != iVar9)) {
                    uVar15 = &((_Vector_impl_data *)uVar15)->_M_finish;
                    goto LAB_0013c2d9;
                  }
                }
LAB_0013c31d:
                if ((double)uVar13 == local_178._M_value.max) {
                  local_1e0 = (int)local_108._M_value.factor;
                  std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                  ::emplace_back<int,int&>
                            ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                              *)&local_178._M_value,&local_1e0,(int *)&local_130);
                }
                else {
                  *(int *)&((_Vector_impl_data *)uVar13)->_M_start =
                       *(int *)&((_Vector_impl_data *)uVar13)->_M_start +
                       (int)local_108._M_value.factor;
                }
              }
              cVar18 = '\0';
              if (iVar9 == -1) goto LAB_0013c48f;
              if (*(int *)((long)local_178._M_value.max + -4) == -1) {
                local_1e8 = 0xb;
                goto LAB_0013c459;
              }
              stream_buffer::pop_front(buf,local_108._M_value.read);
            }
            oVar21 = read_operator(buf_1_04,(buf->buffer_ptr)._M_elems[1]);
            if (((undefined1  [12])
                 oVar21.super__Optional_base<operator_token,_true,_true>._M_payload.
                 super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) ==
                (undefined1  [12])0x0) goto LAB_0013c454;
            stream_buffer::pop_front
                      (buf,oVar21.super__Optional_base<operator_token,_true,_true>._M_payload.
                           super__Optional_payload_base<operator_token>._M_payload._4_4_);
            buf_1_05._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
            buf_1_05._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
            read_real((optional<real_token> *)&local_130._M_value,buf_1_05,
                      (buf->buffer_ptr)._M_elems[1]);
            cVar18 = local_120;
            if (local_120 == '\x01') {
              local_1e0 = (int)(double)CONCAT44(local_130._4_4_,local_130._0_4_);
              stream_buffer::pop_front(buf,local_130._M_value.read);
              iVar9 = oVar21.super__Optional_base<operator_token,_true,_true>._M_payload.
                      super__Optional_payload_base<operator_token>._M_payload._0_4_;
              if (iVar9 == 2) {
                local_1dc = (int)local_1d8;
                std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                          ((vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                           local_180,&local_148,
                           (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            *)&local_178._M_value,&local_1e0,&local_1dc);
              }
              else if (iVar9 == 1) {
                local_1dc = (int)local_1d8;
                std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                          (local_110,&local_148,
                           (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            *)&local_178._M_value,&local_1e0,&local_1dc);
              }
              else {
                if (iVar9 != 0) goto LAB_0013c48f;
                local_1dc = (int)local_1d8;
                std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                          (local_118,&local_148,
                           (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            *)&local_178._M_value,&local_1e0,&local_1dc);
              }
              local_1d8 = (_Vector_impl_data *)CONCAT44(local_1d8._4_4_,(int)local_1d8 + 1);
              goto LAB_0013c48f;
            }
            local_1e8 = 10;
            goto LAB_0013c467;
          }
LAB_0013c48c:
          cVar18 = '\0';
        }
        else {
LAB_0013c454:
          local_1e8 = 10;
LAB_0013c459:
          cVar18 = '\0';
LAB_0013c467:
          local_1f0 = 0;
          rVar20.column = 0;
          rVar20.tag = (undefined4)local_1e8;
          rVar20.line = local_1e8._4_4_;
        }
LAB_0013c48f:
        if ((_Vector_impl_data *)local_178._M_value.min != (_Vector_impl_data *)0x0) {
          operator_delete((void *)local_178._M_value.min,
                          local_178._M_value.name._M_len - local_178._0_8_);
        }
      } while (cVar18 != '\0');
      bVar7 = false;
    }
LAB_0013c5aa:
    if (!bVar7) goto LAB_0013cb80;
    buf_1_06._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_06._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar9 = read_bounds(buf_1_06,(buf->buffer_ptr)._M_elems[1]);
    bVar7 = true;
    if (iVar9 != 0) {
      stream_buffer::pop_front(buf,iVar9);
      sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
      pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
      rhs_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lhs_02._M_str = "binary";
      lhs_02._M_len = 6;
      bVar8 = are_equal(lhs_02,rhs_01);
      if (!bVar8) {
        do {
          lVar19 = 0x18;
          do {
            lVar14 = lVar19;
            if (lVar14 == 0xe8) goto LAB_0013c649;
            rhs_10._M_str = pcVar17;
            rhs_10._M_len = sVar16;
            bVar7 = are_equal(*(string_view *)(&UNK_007389d8 + lVar14),rhs_10);
            lVar19 = lVar14 + 0x10;
          } while (!bVar7);
          if (lVar14 != 0xe8) break;
LAB_0013c649:
          local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          local_108._M_value.name._M_str = (char *)(buf->buffer_ptr)._M_elems[1]._M_len;
          local_108._24_8_ = (buf->buffer_ptr)._M_elems[1]._M_str;
          sStack_e8 = (buf->buffer_ptr)._M_elems[2]._M_len;
          pcStack_e0 = (buf->buffer_ptr)._M_elems[2]._M_str;
          sStack_d8 = (buf->buffer_ptr)._M_elems[3]._M_len;
          pcStack_d0 = (buf->buffer_ptr)._M_elems[3]._M_str;
          sStack_c8 = (buf->buffer_ptr)._M_elems[4]._M_len;
          pcStack_c0 = (buf->buffer_ptr)._M_elems[4]._M_str;
          sStack_b8 = (buf->buffer_ptr)._M_elems[5]._M_len;
          pcStack_b0 = (buf->buffer_ptr)._M_elems[5]._M_str;
          local_a8 = (buf->buffer_ptr)._M_elems[6]._M_len;
          pcStack_a0 = (buf->buffer_ptr)._M_elems[6]._M_str;
          sStack_98 = (buf->buffer_ptr)._M_elems[7]._M_len;
          pcStack_90 = (buf->buffer_ptr)._M_elems[7]._M_str;
          sStack_88 = (buf->buffer_ptr)._M_elems[8]._M_len;
          pcStack_80 = (buf->buffer_ptr)._M_elems[8]._M_str;
          sStack_78 = (buf->buffer_ptr)._M_elems[9]._M_len;
          pcStack_70 = (buf->buffer_ptr)._M_elems[9]._M_str;
          read_bound((optional<bound_token> *)&local_178._M_value,
                     (string_view_array *)&local_108._M_value);
          ppVar6 = local_1d0;
          if (local_150 != '\x01') {
LAB_0013c78f:
            local_1f0 = 0;
            rVar20 = (raw_problem_status)ZEXT812(8);
            bVar7 = false;
            goto LAB_0013c7ad;
          }
          local_180 = (_Vector_impl_data *)local_178._M_value.min;
          local_1d8 = (_Vector_impl_data *)local_178._M_value.max;
          value_02._M_str = local_178._M_value.name._M_str;
          value_02._M_len = local_178._M_value.name._M_len;
          uVar10 = problem_parser::get_variable(local_1d0,value_02);
          if ((int)uVar10 < 0) goto LAB_0013c78f;
          iVar9 = (int)(double)local_180;
          if ((double)local_180 <= -INFINITY) {
            iVar9 = -0x80000000;
          }
          pvVar2 = (ppVar6->m_problem).vars.values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2[uVar10].min = iVar9;
          iVar9 = (int)(double)local_1d8;
          if (INFINITY <= (double)local_1d8) {
            iVar9 = 0x7fffffff;
          }
          pvVar2[uVar10].max = iVar9;
          stream_buffer::pop_front(buf,local_178._M_value.read);
          sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
          pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
          rhs_02._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          rhs_02._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
          lhs_03._M_str = "binary";
          lhs_03._M_len = 6;
          bVar7 = are_equal(lhs_03,rhs_02);
        } while (!bVar7);
        bVar7 = true;
      }
    }
LAB_0013c7ad:
    if (!bVar7) goto LAB_0013cb80;
    buf_1_07._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_07._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar9 = read_binary(buf_1_07,(buf->buffer_ptr)._M_elems[1]);
    bVar7 = true;
    if (iVar9 != 0) {
      stream_buffer::pop_front(buf,iVar9);
      sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
      pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
      rhs_03._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs_03._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lhs_04._M_str = "binary";
      lhs_04._M_len = 6;
      bVar8 = are_equal(lhs_04,rhs_03);
      if (!bVar8) {
        do {
          lVar19 = 0x18;
          do {
            lVar14 = lVar19;
            if (lVar14 == 0xe8) goto LAB_0013c850;
            rhs_11._M_str = pcVar17;
            rhs_11._M_len = sVar16;
            bVar7 = are_equal(*(string_view *)(&UNK_007389d8 + lVar14),rhs_11);
            lVar19 = lVar14 + 0x10;
          } while (!bVar7);
          if (lVar14 != 0xe8) break;
LAB_0013c850:
          ppVar6 = local_1d0;
          value_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          value_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
          uVar10 = problem_parser::get_variable(local_1d0,value_00);
          if ((int)uVar10 < 0) {
            local_1f0 = 0;
            rVar20 = (raw_problem_status)ZEXT812(4);
            bVar7 = false;
            goto LAB_0013c976;
          }
          pvVar2 = (ppVar6->m_problem).vars.values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2[uVar10].type = binary;
          pvVar2 = pvVar2 + uVar10;
          pvVar2->min = 0;
          pvVar2->max = 1;
          local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          pcVar17 = local_1c8->_M_str;
          (buf->buffer_ptr)._M_elems[0]._M_len = local_1c8->_M_len;
          (buf->buffer_ptr)._M_elems[0]._M_str = pcVar17;
          pcVar17 = local_188->_M_str;
          local_1c8->_M_len = local_188->_M_len;
          local_1c8->_M_str = pcVar17;
          pcVar17 = local_190->_M_str;
          local_188->_M_len = local_190->_M_len;
          local_188->_M_str = pcVar17;
          pcVar17 = local_198->_M_str;
          local_190->_M_len = local_198->_M_len;
          local_190->_M_str = pcVar17;
          pcVar17 = local_1a0->_M_str;
          local_198->_M_len = local_1a0->_M_len;
          local_198->_M_str = pcVar17;
          pcVar17 = local_1a8->_M_str;
          local_1a0->_M_len = local_1a8->_M_len;
          local_1a0->_M_str = pcVar17;
          pcVar17 = local_1b0->_M_str;
          local_1a8->_M_len = local_1b0->_M_len;
          local_1a8->_M_str = pcVar17;
          pcVar17 = local_1b8->_M_str;
          local_1b0->_M_len = local_1b8->_M_len;
          local_1b0->_M_str = pcVar17;
          pcVar17 = local_1c0->_M_str;
          local_1b8->_M_len = local_1c0->_M_len;
          local_1b8->_M_str = pcVar17;
          local_1c0->_M_len = (size_t)local_108._M_value.factor;
          local_1c0->_M_str = (char *)local_108._M_value.name._M_len;
          sVar23 = stream_buffer::next_token(buf);
          (buf->buffer_ptr)._M_elems[9] = sVar23;
          sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
          pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
          rhs_04._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          rhs_04._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
          lhs_05._M_str = "binary";
          lhs_05._M_len = 6;
          bVar7 = are_equal(lhs_05,rhs_04);
        } while (!bVar7);
        bVar7 = true;
      }
    }
LAB_0013c976:
    if (!bVar7) goto LAB_0013cb80;
    buf_1_08._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_08._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar9 = read_general(buf_1_08,(buf->buffer_ptr)._M_elems[1]);
    bVar7 = true;
    if (iVar9 != 0) {
      stream_buffer::pop_front(buf,iVar9);
      sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
      pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
      rhs_05._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs_05._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lhs_06._M_str = "binary";
      lhs_06._M_len = 6;
      bVar8 = are_equal(lhs_06,rhs_05);
      while (!bVar8) {
        lVar19 = 0x18;
        do {
          lVar14 = lVar19;
          if (lVar14 == 0xe8) goto LAB_0013ca0f;
          rhs_12._M_str = pcVar17;
          rhs_12._M_len = sVar16;
          bVar8 = are_equal(*(string_view *)(&UNK_007389d8 + lVar14),rhs_12);
          lVar19 = lVar14 + 0x10;
        } while (!bVar8);
        if (lVar14 != 0xe8) break;
LAB_0013ca0f:
        ppVar6 = local_1d0;
        value_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        value_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        uVar10 = problem_parser::get_variable(local_1d0,value_01);
        if ((int)uVar10 < 0) {
          local_1f0 = 0;
          rVar20 = (raw_problem_status)ZEXT812(3);
          bVar7 = false;
          break;
        }
        (ppVar6->m_problem).vars.values.
        super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar10].type = general;
        local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
        local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
        pcVar17 = local_1c8->_M_str;
        (buf->buffer_ptr)._M_elems[0]._M_len = local_1c8->_M_len;
        (buf->buffer_ptr)._M_elems[0]._M_str = pcVar17;
        pcVar17 = local_188->_M_str;
        local_1c8->_M_len = local_188->_M_len;
        local_1c8->_M_str = pcVar17;
        pcVar17 = local_190->_M_str;
        local_188->_M_len = local_190->_M_len;
        local_188->_M_str = pcVar17;
        pcVar17 = local_198->_M_str;
        local_190->_M_len = local_198->_M_len;
        local_190->_M_str = pcVar17;
        pcVar17 = local_1a0->_M_str;
        local_198->_M_len = local_1a0->_M_len;
        local_198->_M_str = pcVar17;
        pcVar17 = local_1a8->_M_str;
        local_1a0->_M_len = local_1a8->_M_len;
        local_1a0->_M_str = pcVar17;
        pcVar17 = local_1b0->_M_str;
        local_1a8->_M_len = local_1b0->_M_len;
        local_1a8->_M_str = pcVar17;
        pcVar17 = local_1b8->_M_str;
        local_1b0->_M_len = local_1b8->_M_len;
        local_1b0->_M_str = pcVar17;
        pcVar17 = local_1c0->_M_str;
        local_1b8->_M_len = local_1c0->_M_len;
        local_1b8->_M_str = pcVar17;
        local_1c0->_M_len = (size_t)local_108._M_value.factor;
        local_1c0->_M_str = (char *)local_108._M_value.name._M_len;
        sVar23 = stream_buffer::next_token(buf);
        (buf->buffer_ptr)._M_elems[9] = sVar23;
        sVar16 = (buf->buffer_ptr)._M_elems[0]._M_len;
        pcVar17 = (buf->buffer_ptr)._M_elems[0]._M_str;
        rhs_06._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        rhs_06._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        lhs_07._M_str = "binary";
        lhs_07._M_len = 6;
        bVar8 = are_equal(lhs_07,rhs_06);
      }
    }
    if (!bVar7) goto LAB_0013cb80;
    buf_1_09._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_09._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar9 = read_end(buf_1_09,(buf->buffer_ptr)._M_elems[1]);
    if (iVar9 != 0) {
      stream_buffer::pop_front(buf,iVar9);
      local_1f0 = 0;
      rVar20.line = 0;
      rVar20.column = 0;
      rVar20.tag = (uint)((buf->buffer_ptr)._M_elems[0]._M_len != 0) * 2;
      goto LAB_0013cb80;
    }
    uVar12 = 9;
  }
  local_1f0 = 0;
  rVar20.column = 0;
  rVar20.tag = (int)uVar12;
  rVar20.line = (int)(uVar12 >> 0x20);
LAB_0013cb80:
  local_1f4 = rVar20.column;
  local_1e8 = rVar20._0_8_;
  rVar22._0_8_ = local_1e8 & 0xffffffff | local_1f0 << 0x20;
  rVar22.column = local_1f4;
  return rVar22;
}

Assistant:

raw_problem_status
parse([[maybe_unused]] const baryonyx::context& ctx,
      stream_buffer& buf,
      problem_parser& p) noexcept
{
    if (auto obj_type = read_objective_type(buf.first()); !obj_type)
        return baryonyx::file_format_error_tag::bad_objective_function_type;
    else
        p.m_problem.type = *obj_type;

    buf.pop_front();

    if (auto read = try_read_objective_label(buf.first(), buf.second()); read)
        buf.pop_front(read);

    while (!is_keyword(buf.first())) {
        if (starts_with_quadratic(buf.first(), buf.second())) {
            double factor = 1.0;

            if (buf.first() == "-") {
                factor = -1.0;
                buf.pop_front();
            } else if (buf.first() == "+") {
                buf.pop_front();
            }

            if (auto ret = read_quadratic_element(buf, p, factor); !ret)
                return ret;
            continue;
        }

        if (auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            elem) {
            if (!p.append_to_objective(*elem))
                return baryonyx::file_format_error_tag::too_many_variables;

            buf.pop_front(elem->read);
            continue;
        }

        return baryonyx::file_format_error_tag::bad_objective;
    }

    if (auto read = read_subject_to(buf.first(), buf.second(), buf.third());
        read) {
        buf.pop_front(read);
        int constraint_next_id = 0;

        while (!buf.first().empty() && !is_keyword(buf.first())) {
            std::string_view label;
            int value;
            std::vector<baryonyx::function_element> elements;

            if (starts_with_name(buf.first()) && buf.second() == ":") {
                label = p.m_problem.strings->append(buf.first());
                buf.pop_front(2);
            }

            auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            if (!elem)
                return baryonyx::file_format_error_tag::bad_constraint;

            {
                auto id = p.get_or_assign_variable(elem->name);
                if (id == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                auto it = std::find_if(
                  elements.begin(), elements.end(), [id](const auto& elem) {
                      return elem.variable_index == id;
                  });

                if (it == elements.end())
                    elements.emplace_back(static_cast<int>(elem->factor), id);
                else
                    it->factor += static_cast<int>(elem->factor);
            }

            buf.pop_front(elem->read);

            while (!buf.first().empty() &&
                   !starts_with_operator(buf.first())) {
                elem = read_function_element(
                  buf.first(), buf.second(), buf.third());
                if (!elem)
                    return baryonyx::file_format_error_tag::bad_constraint;

                {
                    auto id = p.get_or_assign_variable(elem->name);
                    if (id == -1)
                        return baryonyx::file_format_error_tag::
                          too_many_variables;

                    auto it =
                      std::find_if(elements.begin(),
                                   elements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index == id;
                                   });

                    if (it == elements.end())
                        elements.emplace_back(static_cast<int>(elem->factor),
                                              id);
                    else
                        it->factor += static_cast<int>(elem->factor);
                }

                if (elements.back().variable_index == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                buf.pop_front(elem->read);
            }

            auto operator_opt = read_operator(buf.first(), buf.second());
            if (!operator_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            buf.pop_front(operator_opt->read);

            auto value_opt = read_real(buf.first(), buf.second());
            if (!value_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            value = static_cast<int>(value_opt->value);
            buf.pop_front(value_opt->read);

            switch (operator_opt->op) {
            case baryonyx::operator_type::equal:
                p.m_problem.equal_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::greater:
                p.m_problem.greater_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::less:
                p.m_problem.less_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            }
        }

        if (p.m_problem.equal_constraints.size() +
              p.m_problem.greater_constraints.size() +
              p.m_problem.less_constraints.size() >
            baryonyx::to_unsigned(INT_MAX))
            return baryonyx::file_format_error_tag::too_many_constraints;
    }

    if (auto read = read_bounds(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first())) {
            auto bound_opt = read_bound(buf.array());
            if (!bound_opt)
                return baryonyx::file_format_error_tag::bad_bound;

            if (!p.set_bound_variable(*bound_opt))
                return baryonyx::file_format_error_tag::bad_bound;

            buf.pop_front(bound_opt->read);
        }
    }

    if (auto read = read_binary(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_boolean_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_binary;
            else
                buf.pop_front();
    }

    if (auto read = read_general(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_integer_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_general;
            else
                buf.pop_front();
    }

    if (auto read = read_end(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        return buf.first().empty()
                 ? baryonyx::file_format_error_tag::success
                 : baryonyx::file_format_error_tag::bad_end_of_file;
    }

    return baryonyx::file_format_error_tag::bad_end;
}